

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseThunkFinallyFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseThunkFinallyFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,Var value,bool shouldThrow)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  DynamicType *type;
  JavascriptPromiseThunkFinallyFunction *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  local_68 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1a25;
  data._32_8_ = value;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  FunctionInfo::FunctionInfo(this_00,entryPoint,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  type = CreateDeferredPrototypeFunctionType(this,entryPoint);
  local_68 = (undefined1  [8])&JavascriptPromiseThunkFinallyFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1a28;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  this_01 = (JavascriptPromiseThunkFinallyFunction *)
            new<(Memory::ObjectInfoBits)1>(0x50,pRVar1,&local_31);
  JavascriptPromiseThunkFinallyFunction::JavascriptPromiseThunkFinallyFunction
            (this_01,type,this_00,(Var)data._32_8_,shouldThrow);
  return this_01;
}

Assistant:

JavascriptPromiseThunkFinallyFunction* JavascriptLibrary::CreatePromiseThunkFinallyFunction(JavascriptMethod entryPoint, Var value, bool shouldThrow)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseThunkFinallyFunction, type, functionInfo, value, shouldThrow);
    }